

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

void rw::d3d9::defaultInstanceCB(Geometry *geo,InstanceDataHeader *header,bool32 reinstance)

{
  uint32 stride_00;
  bool32 bVar1;
  VertexStream *pVVar2;
  void *pvVar3;
  uint8 *puVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint local_b4;
  int32 n_2;
  uint32 stride_1;
  uint32 n_1;
  InstanceData *inst;
  uint8 *verts;
  int32 n;
  uint16 stride;
  bool hasNormals;
  bool isPrelit;
  VertexStream *s;
  VertexElement dcl [12];
  int local_20;
  int i;
  bool32 reinstance_local;
  InstanceDataHeader *header_local;
  Geometry *geo_local;
  
  pVVar2 = header->vertexStream;
  bVar5 = (geo->flags & 8) != 0;
  bVar6 = (geo->flags & 0x10) != 0;
  if (reinstance == 0) {
    header->vertexStream[0].offset = 0;
    header->vertexStream[0].managed = '\x01';
    header->vertexStream[0].geometryFlags = 0;
    header->vertexStream[0].dynamicLock = '\0';
    s._0_2_ = 0;
    s._2_2_ = 0;
    s._4_1_ = 2;
    s._5_1_ = 0;
    s._6_1_ = 0;
    s._7_1_ = 0;
    local_20 = 1;
    verts._4_2_ = 0xc;
    header->vertexStream[0].geometryFlags = header->vertexStream[0].geometryFlags | 2;
    if (bVar5) {
      dcl[0].stream = 0;
      dcl[0].offset = 0xc;
      dcl[0].type = '\x04';
      dcl[0].method = '\0';
      dcl[0].usage = '\n';
      dcl[0].usageIndex = '\0';
      local_20 = 2;
      header->vertexStream[0].geometryFlags = header->vertexStream[0].geometryFlags | 8;
      verts._4_2_ = 0x10;
    }
    for (verts._0_4_ = 0; (int)verts < geo->numTexCoordSets; verts._0_4_ = (int)verts + 1) {
      dcl[(long)local_20 + -1].stream = 0;
      dcl[(long)local_20 + -1].offset = verts._4_2_;
      dcl[(long)local_20 + -1].type = '\x01';
      dcl[(long)local_20 + -1].method = '\0';
      dcl[(long)local_20 + -1].usage = '\x05';
      dcl[(long)local_20 + -1].usageIndex = (byte)(int)verts;
      local_20 = local_20 + 1;
      header->vertexStream[0].geometryFlags =
           header->vertexStream[0].geometryFlags | (ushort)(0x10 << ((byte)(int)verts & 0x1f));
      verts._4_2_ = verts._4_2_ + 8;
    }
    if (bVar6) {
      dcl[(long)local_20 + -1].stream = 0;
      dcl[(long)local_20 + -1].offset = verts._4_2_;
      dcl[(long)local_20 + -1].type = '\x02';
      dcl[(long)local_20 + -1].method = '\0';
      dcl[(long)local_20 + -1].usage = '\x03';
      dcl[(long)local_20 + -1].usageIndex = '\0';
      local_20 = local_20 + 1;
      header->vertexStream[0].geometryFlags = header->vertexStream[0].geometryFlags | 4;
      verts._4_2_ = verts._4_2_ + 0xc;
    }
    if (!bVar5) {
      dcl[(long)local_20 + -1].stream = 2;
      dcl[(long)local_20 + -1].offset = 0xc;
      dcl[(long)local_20 + -1].type = '\x04';
      dcl[(long)local_20 + -1].method = '\0';
      dcl[(long)local_20 + -1].usage = '\n';
      dcl[(long)local_20 + -1].usageIndex = '\0';
      local_20 = local_20 + 1;
    }
    if (geo->numTexCoordSets == 0) {
      dcl[(long)local_20 + -1].stream = 2;
      dcl[(long)local_20 + -1].offset = 0x10;
      dcl[(long)local_20 + -1].type = '\x01';
      dcl[(long)local_20 + -1].method = '\0';
      dcl[(long)local_20 + -1].usage = '\x05';
      dcl[(long)local_20 + -1].usageIndex = '\0';
      local_20 = local_20 + 1;
    }
    dcl[(long)local_20 + -1] = _d3ddec_end;
    header->vertexStream[0].stride = (uint)verts._4_2_;
    pvVar3 = createVertexDeclaration((VertexElement *)&s);
    header->vertexDeclaration = pvVar3;
    pvVar3 = d3d::createVertexBuffer
                       (header->totalNumVertex * header->vertexStream[0].stride,0,false);
    pVVar2->vertexBuffer = pvVar3;
  }
  else {
    getDeclaration(header->vertexDeclaration,(VertexElement *)&s);
  }
  puVar4 = d3d::lockVertices(pVVar2->vertexBuffer,0,0,0);
  if ((reinstance == 0) || ((geo->lockedSinceInst & 2) != 0)) {
    local_20 = 0;
    while( true ) {
      bVar7 = true;
      if (dcl[(long)local_20 + -1].usage == '\0') {
        bVar7 = dcl[(long)local_20 + -1].usageIndex != '\0';
      }
      if (!bVar7) break;
      local_20 = local_20 + 1;
    }
    instV3d(*(int *)(d3d::vertFormatMap + (ulong)dcl[(long)local_20 + -1].type * 4),
            puVar4 + (int)(uint)dcl[(long)local_20 + -1].offset,geo->morphTargets->vertices,
            header->totalNumVertex,header->vertexStream[dcl[(long)local_20 + -1].stream].stride);
  }
  if ((bVar5) && ((reinstance == 0 || ((geo->lockedSinceInst & 8) != 0)))) {
    local_20 = 0;
    while( true ) {
      bVar5 = true;
      if (dcl[(long)local_20 + -1].usage == '\n') {
        bVar5 = dcl[(long)local_20 + -1].usageIndex != '\0';
      }
      if (!bVar5) break;
      local_20 = local_20 + 1;
    }
    _stride_1 = header->inst;
    n_2 = header->numMeshes;
    while (n_2 != 0) {
      stride_00 = header->vertexStream[dcl[(long)local_20 + -1].stream].stride;
      bVar1 = instColor(*(int *)(d3d::vertFormatMap + (ulong)dcl[(long)local_20 + -1].type * 4),
                        puVar4 + (ulong)(stride_00 * _stride_1->minVert) +
                                 (long)(int)(uint)dcl[(long)local_20 + -1].offset,
                        geo->colors + _stride_1->minVert,_stride_1->numVertices,stride_00);
      _stride_1->vertexAlpha = bVar1;
      _stride_1 = _stride_1 + 1;
      n_2 = n_2 + -1;
    }
  }
  for (local_b4 = 0; (int)local_b4 < geo->numTexCoordSets; local_b4 = local_b4 + 1) {
    if ((reinstance == 0) || (((uint)geo->lockedSinceInst & 0x10 << ((byte)local_b4 & 0x1f)) != 0))
    {
      local_20 = 0;
      while( true ) {
        bVar5 = true;
        if (dcl[(long)local_20 + -1].usage == '\x05') {
          bVar5 = dcl[(long)local_20 + -1].usageIndex != local_b4;
        }
        if (!bVar5) break;
        local_20 = local_20 + 1;
      }
      instTexCoords(*(int *)(d3d::vertFormatMap + (ulong)dcl[(long)local_20 + -1].type * 4),
                    puVar4 + (int)(uint)dcl[(long)local_20 + -1].offset,
                    geo->texCoords[(int)local_b4],header->totalNumVertex,
                    header->vertexStream[dcl[(long)local_20 + -1].stream].stride);
    }
  }
  if ((bVar6) && ((reinstance == 0 || ((geo->lockedSinceInst & 4) != 0)))) {
    local_20 = 0;
    while( true ) {
      bVar5 = true;
      if (dcl[(long)local_20 + -1].usage == '\x03') {
        bVar5 = dcl[(long)local_20 + -1].usageIndex != '\0';
      }
      if (!bVar5) break;
      local_20 = local_20 + 1;
    }
    instV3d(*(int *)(d3d::vertFormatMap + (ulong)dcl[(long)local_20 + -1].type * 4),
            puVar4 + (int)(uint)dcl[(long)local_20 + -1].offset,geo->morphTargets->normals,
            header->totalNumVertex,header->vertexStream[dcl[(long)local_20 + -1].stream].stride);
  }
  d3d::unlockVertices(pVVar2->vertexBuffer);
  return;
}

Assistant:

void
defaultInstanceCB(Geometry *geo, InstanceDataHeader *header, bool32 reinstance)
{
	int i = 0;
	VertexElement dcl[NUMDECLELT];
	VertexStream *s = &header->vertexStream[0];

	bool isPrelit = (geo->flags & Geometry::PRELIT) != 0;
	bool hasNormals = (geo->flags & Geometry::NORMALS) != 0;

	// TODO: support both vertex buffers

	if(!reinstance){
		// Create declarations and buffers only the first time

		assert(s->vertexBuffer == nil);
		s->offset = 0;
		s->managed = 1;
		s->geometryFlags = 0;
		s->dynamicLock = 0;

		dcl[i].stream = 0;
		dcl[i].offset = 0;
		dcl[i].type = D3DDECLTYPE_FLOAT3;
		dcl[i].method = D3DDECLMETHOD_DEFAULT;
		dcl[i].usage = D3DDECLUSAGE_POSITION;
		dcl[i].usageIndex = 0;
		i++;
		uint16 stride = 12;
		s->geometryFlags |= 0x2;

		if(isPrelit){
			dcl[i].stream = 0;
			dcl[i].offset = stride;
			dcl[i].type = D3DDECLTYPE_D3DCOLOR;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_COLOR;
			dcl[i].usageIndex = 0;
			i++;
			s->geometryFlags |= 0x8;
			stride += 4;
		}

		for(int32 n = 0; n < geo->numTexCoordSets; n++){
			dcl[i].stream = 0;
			dcl[i].offset = stride;
			dcl[i].type = D3DDECLTYPE_FLOAT2;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_TEXCOORD;
			dcl[i].usageIndex = (uint8)n;
			i++;
			s->geometryFlags |= 0x10 << n;
			stride += 8;
		}

		if(hasNormals){
			dcl[i].stream = 0;
			dcl[i].offset = stride;
			dcl[i].type = D3DDECLTYPE_FLOAT3;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_NORMAL;
			dcl[i].usageIndex = 0;
			i++;
			s->geometryFlags |= 0x4;
			stride += 12;
		}

		// We expect some attributes to always be there, use the constant buffer as fallback
		if(!isPrelit){
			dcl[i].stream = 2;
			dcl[i].offset = offsetof(VertexConstantData, color);
			dcl[i].type = D3DDECLTYPE_D3DCOLOR;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_COLOR;
			dcl[i].usageIndex = 0;
			i++;
		}
		if(geo->numTexCoordSets == 0){
			dcl[i].stream = 2;
			dcl[i].offset = offsetof(VertexConstantData, texCoors[0]);
			dcl[i].type = D3DDECLTYPE_FLOAT2;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_TEXCOORD;
			dcl[i].usageIndex = 0;
			i++;
		}

		dcl[i] = D3DDECL_END();
		s->stride = stride;

		assert(header->vertexDeclaration == nil);
		header->vertexDeclaration = createVertexDeclaration((VertexElement*)dcl);

		assert(s->vertexBuffer == nil);
		s->vertexBuffer = createVertexBuffer(header->totalNumVertex*s->stride, 0, false);
	}else
		getDeclaration(header->vertexDeclaration, dcl);

	uint8 *verts = lockVertices(s->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);

	// Instance vertices
	if(!reinstance || geo->lockedSinceInst&Geometry::LOCKVERTICES){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_POSITION || dcl[i].usageIndex != 0; i++)
			;
		instV3d(vertFormatMap[dcl[i].type], verts + dcl[i].offset,
			geo->morphTargets[0].vertices,
			header->totalNumVertex,
			header->vertexStream[dcl[i].stream].stride);
	}

	// Instance prelight colors
	if(isPrelit && (!reinstance || geo->lockedSinceInst&Geometry::LOCKPRELIGHT)){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_COLOR || dcl[i].usageIndex != 0; i++)
			;
		InstanceData *inst = header->inst;
		uint32 n = header->numMeshes;
		while(n--){
			uint32 stride = header->vertexStream[dcl[i].stream].stride;
			inst->vertexAlpha = instColor(vertFormatMap[dcl[i].type],
				verts + dcl[i].offset + stride*inst->minVert,
				geo->colors + inst->minVert,
				inst->numVertices,
				stride);
			inst++;
		}
	}

	// Instance tex coords
	for(int32 n = 0; n < geo->numTexCoordSets; n++){
		if(!reinstance || geo->lockedSinceInst&(Geometry::LOCKTEXCOORDS<<n)){
			for(i = 0; dcl[i].usage != D3DDECLUSAGE_TEXCOORD || dcl[i].usageIndex != n; i++)
				;
			instTexCoords(vertFormatMap[dcl[i].type], verts + dcl[i].offset,
				geo->texCoords[n],
				header->totalNumVertex,
				header->vertexStream[dcl[i].stream].stride);
		}
	}

	// Instance normals
	if(hasNormals && (!reinstance || geo->lockedSinceInst&Geometry::LOCKNORMALS)){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_NORMAL || dcl[i].usageIndex != 0; i++)
			;
		instV3d(vertFormatMap[dcl[i].type], verts + dcl[i].offset,
			geo->morphTargets[0].normals,
			header->totalNumVertex,
			header->vertexStream[dcl[i].stream].stride);
	}
	unlockVertices(s->vertexBuffer);
}